

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Minefield_Query_PDU::Minefield_Query_PDU(Minefield_Query_PDU *this)

{
  Minefield_Query_PDU *this_local;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Query_PDU_0032f0a0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReqID);
  this->m_ui8ReqID = '\0';
  this->m_ui8NumPerimPoints = '\0';
  this->m_ui8Padding1 = '\0';
  this->m_ui8NumSensTyp = '\0';
  DATA_TYPE::MinefieldDataFilter::MinefieldDataFilter(&this->m_DataFilter);
  DATA_TYPE::EntityType::EntityType(&this->m_MineTypFilter);
  std::
  vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ::vector(&this->m_vPoints);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vui16SensorTypes);
  this->m_bNeedsPadding = false;
  this->m_ui16Padding1 = 0;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '&';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  return;
}

Assistant:

Minefield_Query_PDU::Minefield_Query_PDU() :
    m_ui8ReqID( 0 ),
    m_ui8NumPerimPoints( 0 ),
    m_ui8Padding1( 0 ),
    m_ui8NumSensTyp( 0 ),
    m_bNeedsPadding( 0 ),
    m_ui16Padding1( 0 )
{
    m_ui8PDUType = MinefieldQuery_PDU_Type;
    m_ui16PDULength = MINEFIELD_QUERY_PDU_SIZE;
}